

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_bind_list.c
# Opt level: O3

int mpt_output_bind_list(mpt_output *out,mpt_node *conf)

{
  _func_ssize_t_mpt_output_ptr_size_t_void_ptr *p_Var1;
  int iVar2;
  undefined8 in_RAX;
  char *__s;
  char *__s_00;
  ssize_t sVar3;
  size_t sVar4;
  mpt_msgtype mt;
  undefined8 uStack_38;
  
  iVar2 = -1;
  uStack_38 = in_RAX;
  if (conf != (mpt_node *)0x0) {
    do {
      __s = (char *)mpt_node_ident(conf);
      if (((__s != (char *)0x0) && (conf->_meta != (mpt_metatype *)0x0)) &&
         (__s_00 = (char *)mpt_convertable_data(conf->_meta,0), __s_00 != (char *)0x0)) {
        uStack_38 = CONCAT26(0x320c,(undefined6)uStack_38);
        iVar2 = (*out->_vptr->await)(out,(_func_int_void_ptr_mpt_message_ptr *)0x0,(void *)0x0);
        if (iVar2 < 0) {
          return -1;
        }
        sVar3 = (*out->_vptr->push)(out,2,(void *)((long)&uStack_38 + 6));
        if (sVar3 < 0) {
          return -1;
        }
        p_Var1 = out->_vptr->push;
        sVar4 = strlen(__s_00);
        sVar3 = (*p_Var1)(out,sVar4 + 1,__s_00);
        if (sVar3 < 0) {
LAB_001084b6:
          (*out->_vptr->push)(out,1,(void *)0x0);
          return -1;
        }
        p_Var1 = out->_vptr->push;
        sVar4 = strlen(__s);
        sVar3 = (*p_Var1)(out,sVar4,__s);
        if ((sVar3 < 0) || (sVar3 = (*out->_vptr->push)(out,0,(void *)0x0), sVar3 < 0))
        goto LAB_001084b6;
      }
      conf = conf->next;
    } while (conf != (mpt_node *)0x0);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

extern int mpt_output_bind_list(MPT_INTERFACE(output) *out, const MPT_STRUCT(node) *conf)
{
	int nbind = 0;
	
	if (!conf) {
		return MPT_ERROR(BadArgument);
	}
	do {
		MPT_INTERFACE(metatype) *meta;
		const char *src, *dest;
		MPT_STRUCT(msgtype) mt;
		ssize_t len;
		
		if (!(dest = mpt_node_ident(conf))) {
			continue;
		}
		if (!(meta = conf->_meta) || !(src = mpt_convertable_data((MPT_INTERFACE(convertable) *) meta, 0))) {
			continue;
		}
		mt.cmd = MPT_MESGTYPE(Graphic);
		mt.arg = MPT_MESGGRF(BindingAdd) | MPT_MESGGRF(BindingParse);
		
		if ((len = out->_vptr->await(out, 0, 0)) < 0) {
			return nbind ? nbind : -1;
		}
		if ((len = out->_vptr->push(out, sizeof(mt), &mt)) >= 0) {
			if ((len = out->_vptr->push(out, strlen(src)+1, src)) < 0
			    || (len = out->_vptr->push(out, strlen(dest), dest)) < 0
			    || (len = out->_vptr->push(out, 0, 0)) < 0) {
				out->_vptr->push(out, 1, 0);
			}
		}
		if (len < 0) {
			return nbind ? nbind : -1;
		}
	} while ((conf = conf->next));
	
	return nbind;
}